

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O1

wstring_view __thiscall mjs::ltrim(mjs *this,wstring_view s,version ver)

{
  bool bVar1;
  mjs *pmVar2;
  mjs *pmVar3;
  wstring_view wVar4;
  
  if (this == (mjs *)0x0) {
    pmVar3 = (mjs *)0x0;
  }
  else {
    pmVar2 = (mjs *)0x0;
    do {
      bVar1 = is_whitespace_or_line_terminator
                        (*(char16_t *)(s._M_len + (long)pmVar2 * 4),(version)s._M_str);
      pmVar3 = pmVar2;
      if (!bVar1) break;
      pmVar2 = pmVar2 + 1;
      pmVar3 = this;
    } while (this != pmVar2);
  }
  wVar4._M_len = (long)this - (long)pmVar3;
  if (this < pmVar3) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pmVar3
               ,this);
  }
  wVar4._M_str = (wchar_t *)(s._M_len + (long)pmVar3 * 4);
  return wVar4;
}

Assistant:

std::wstring_view ltrim(std::wstring_view s, version ver) {
    size_t start_pos = 0;
    while (start_pos < s.length() && is_whitespace_or_line_terminator(s[start_pos], ver)) {
        ++start_pos;
    }
    return s.substr(start_pos);
}